

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O2

void __thiscall streams_tests::streams_buffered_file::test_method(streams_buffered_file *this)

{
  long lVar1;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  bool bVar2;
  byte bVar3;
  FILE *pFVar4;
  ulong uVar5;
  uint8_t j_1;
  long lVar6;
  uint8_t j;
  uint8_t obj;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  undefined4 in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff75c;
  check_type cVar12;
  char **ppcVar11;
  assertion_result *ar;
  assertion_result *ar_00;
  pointer in_stack_fffffffffffff768;
  char *local_890;
  char *local_888;
  undefined1 *local_880;
  undefined1 *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  undefined1 *local_610;
  undefined1 *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  uint8_t i;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 local_178 [16];
  undefined1 *local_168;
  char **local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  BufferedFile bf;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_f8;
  AutoFile file;
  uint8_t a [29];
  path local_88;
  path streams_test_filename;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  fs::operator/(&streams_test_filename,(path *)&local_88,"streams_test_tmp");
  std::filesystem::__cxx11::path::~path(&local_88);
  pFVar4 = fsbridge::fopen((char *)&streams_test_filename,"w+b");
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start._4_4_ = in_stack_fffffffffffff75c;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start._0_4_ = in_stack_fffffffffffff758;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)_cVar12;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff768;
  AutoFile::AutoFile(&file,(FILE *)pFVar4,data_xor);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_f8);
  for (obj = '\0'; obj != '('; obj = obj + '\x01') {
    ser_writedata8<AutoFile>(&file,obj);
  }
  AutoFile::seek(&file,0,0);
  BufferedFile::BufferedFile(&bf,&file,0x19,0x19);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140 = "";
  local_158 = "";
  local_150 = "";
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file_00.m_end = (iterator)0x10e;
  file_00.m_begin = (iterator)&local_148;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_158,msg);
  a._0_8_ = a._0_8_ & 0xffffffffffffff00;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_160 = &local_188;
  local_188 = "false";
  local_180 = "";
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_0113a070;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_190 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_178,1,0,WARN,_cVar12,(size_t)&local_198,
             0x10e);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  BufferedFile::BufferedFile(&bf,&file,0x19,10);
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  file_01.m_end = (iterator)0x116;
  file_01.m_begin = (iterator)&local_1d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1e8,
             msg_00);
  bVar2 = BufferedFile::eof(&bf);
  a[0] = !bVar2;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_160 = &local_188;
  local_188 = "!bf.eof()";
  local_180 = "";
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_0113a070;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_1f0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_178,1,0,WARN,_cVar12,(size_t)&local_1f8,
             0x116);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  i = ser_readdata8<BufferedFile>(&bf);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  file_02.m_end = (iterator)0x11a;
  file_02.m_begin = (iterator)&local_210;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_220,
             msg_01);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_228 = "";
  a._0_8_ = a._0_8_ & 0xffffffff00000000;
  pvVar7 = (iterator)0x2;
  puVar9 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_178,&local_230,0x11a,1,2,puVar9,0xba9066,(assertion_result *)a,"0");
  i = ser_readdata8<BufferedFile>(&bf);
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)puVar9;
  msg_02.m_begin = pvVar7;
  file_03.m_end = (iterator)0x11c;
  file_03.m_begin = (iterator)&local_240;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_250,
             msg_02);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_258 = "";
  a[0] = '\x01';
  a[1] = '\0';
  a[2] = '\0';
  a[3] = '\0';
  pvVar7 = (iterator)0x2;
  puVar9 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_178,&local_260,0x11c,1,2,puVar9,0xba9066,(assertion_result *)a,"1");
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)puVar9;
  msg_03.m_begin = pvVar7;
  file_04.m_end = (iterator)0x11f;
  file_04.m_begin = (iterator)&local_270;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_280,
             msg_03);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_288 = "";
  puVar9 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_188 = (char *)CONCAT44(local_188._4_4_,2);
  ppcVar11 = &local_188;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_178,&local_290,0x11f,1,2,puVar9,0xc3c279,ppcVar11,"2U");
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)puVar9;
  msg_04.m_begin = pvVar7;
  file_05.m_end = (iterator)0x122;
  file_05.m_begin = (iterator)&local_2a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2b0,
             msg_04);
  uVar5 = (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  bf.m_read_pos = 0;
  if (bf.nSrcPos >= uVar5) {
    bf.m_read_pos = bf.nSrcPos - uVar5;
  }
  ar = (assertion_result *)a;
  a[0] = bf.nSrcPos < uVar5 || bf.nSrcPos - uVar5 == 0;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_188 = "bf.SetPos(0)";
  local_180 = "";
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_0113a070;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_2b8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (ar,(lazy_ostream *)local_178,1,0,WARN,(check_type)ppcVar11,(size_t)&local_2c0,0x122);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  i = ser_readdata8<BufferedFile>(&bf);
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar7;
  file_06.m_end = (iterator)0x124;
  file_06.m_begin = (iterator)&local_2d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2e0,
             msg_05);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_2e8 = "";
  a._0_8_ = a._0_8_ & 0xffffffff00000000;
  pvVar7 = (iterator)0x2;
  puVar9 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_178,&local_2f0,0x124,1,2,puVar9,0xba9066,ar,"0");
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)puVar9;
  msg_06.m_begin = pvVar7;
  file_07.m_end = (iterator)0x127;
  file_07.m_begin = (iterator)&local_300;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_310,
             msg_06);
  bf.m_read_pos = 2;
  if (1 >= bf.nSrcPos) {
    bf.m_read_pos = bf.nSrcPos;
  }
  bVar2 = bf.nSrcPos <=
          ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 2U;
  if (!bVar2) {
    bf.m_read_pos =
         bf.nSrcPos -
         ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  ar_00 = (assertion_result *)a;
  a[0] = bVar2 && 1 < bf.nSrcPos;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_188 = "bf.SetPos(2)";
  local_180 = "";
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_0113a070;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_318 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (ar_00,(lazy_ostream *)local_178,1,0,WARN,(check_type)ar,(size_t)&local_320,0x127);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  i = ser_readdata8<BufferedFile>(&bf);
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar7;
  file_08.m_end = (iterator)0x129;
  file_08.m_begin = (iterator)&local_330;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_340,
             msg_07);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_348 = "";
  a[0] = '\x02';
  a[1] = '\0';
  a[2] = '\0';
  a[3] = '\0';
  pvVar7 = (iterator)0x2;
  puVar9 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_178,&local_350,0x129,1,2,puVar9,0xba9066,ar_00,"2");
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)puVar9;
  msg_08.m_begin = pvVar7;
  file_09.m_end = (iterator)0x12f;
  file_09.m_begin = (iterator)&local_360;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_370,
             msg_08);
  if (bf.m_read_pos < 4) {
    bf.nReadLimit = 3;
  }
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_188 = "bf.SetLimit(3)";
  local_180 = "";
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_0113a070;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_378 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  a[0] = bf.m_read_pos < 4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_178,1,0,WARN,(check_type)ar_00,
             (size_t)&local_380,0x12f);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  i = ser_readdata8<BufferedFile>(&bf);
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar7;
  file_10.m_end = (iterator)0x132;
  file_10.m_begin = (iterator)&local_390;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3a0,
             msg_09);
  a[0] = '\0';
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_188 = "false";
  local_180 = "";
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_0113a070;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_3a8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_178,1,0,WARN,(check_type)ar_00,
             (size_t)&local_3b0,0x132);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar8;
  msg_10.m_begin = pvVar7;
  file_11.m_end = (iterator)0x138;
  file_11.m_begin = (iterator)&local_3f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_400,
             msg_10);
  bf.nReadLimit = 0xffffffffffffffff;
  a[0] = '\x01';
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_188 = "bf.SetLimit()";
  local_180 = "";
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_0113a070;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_408 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_178,1,0,WARN,(check_type)ar_00,
             (size_t)&local_410,0x138);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar8;
  msg_11.m_begin = pvVar7;
  file_12.m_end = (iterator)0x13a;
  file_12.m_begin = (iterator)&local_420;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_430,
             msg_11);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_438 = "";
  puVar9 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_188 = (char *)CONCAT44(local_188._4_4_,3);
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_178,&local_440,0x13a,1,2,puVar9,0xc3c279,&local_188,"3U");
  bVar3 = 3;
  while (a[0] = bVar3, bVar3 < 10) {
    i = ser_readdata8<BufferedFile>(&bf);
    local_450 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_448 = "";
    local_460 = &boost::unit_test::basic_cstring<char_const>::null;
    local_458 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_12.m_end = (iterator)puVar9;
    msg_12.m_begin = pvVar7;
    file_13.m_end = (iterator)0x13f;
    file_13.m_begin = (iterator)&local_450;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_460,
               msg_12);
    local_178[8] = false;
    local_178._0_8_ = &PTR__lazy_ostream_01139f30;
    local_168 = boost::unit_test::lazy_ostream::inst;
    local_160 = (char **)0xc694e1;
    local_470 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_468 = "";
    pvVar7 = (iterator)0x2;
    puVar9 = &i;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_char>
              (local_178,&local_470,0x13f,1,2,&i,0xba9066,a,"j");
    bVar3 = a[0] + 1;
  }
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = (iterator)puVar9;
  msg_13.m_begin = pvVar7;
  file_14.m_end = (iterator)0x141;
  file_14.m_begin = (iterator)&local_480;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_490,
             msg_13);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_498 = "";
  puVar9 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_188 = (char *)CONCAT44(local_188._4_4_,10);
  ppcVar11 = &local_188;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_178,&local_4a0,0x141,1,2,puVar9,0xc3c279,ppcVar11,"10U");
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = (iterator)puVar9;
  msg_14.m_begin = pvVar7;
  file_15.m_end = (iterator)0x144;
  file_15.m_begin = (iterator)&local_4b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_4c0,
             msg_14);
  uVar5 = (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  bf.m_read_pos = 0;
  if (bf.nSrcPos >= uVar5) {
    bf.m_read_pos = bf.nSrcPos - uVar5;
  }
  a[0] = bf.nSrcPos < uVar5 || bf.nSrcPos - uVar5 == 0;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_188 = "bf.SetPos(0)";
  local_180 = "";
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_0113a070;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_4c8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_178,1,0,WARN,(check_type)ppcVar11,
             (size_t)&local_4d0,0x144);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar8;
  msg_15.m_begin = pvVar7;
  file_16.m_end = (iterator)0x145;
  file_16.m_begin = (iterator)&local_4e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_4f0,
             msg_15);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_4f8 = "";
  puVar9 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_188 = (char *)((ulong)local_188 & 0xffffffff00000000);
  pvVar7 = (iterator)0x2;
  puVar10 = puVar9;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_178,&local_500,0x145,1,2,puVar9,0xc3c279,&local_188,"0U");
  i = ser_readdata8<BufferedFile>(&bf);
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = (iterator)puVar10;
  msg_16.m_begin = pvVar7;
  file_17.m_end = (iterator)0x147;
  file_17.m_begin = (iterator)&local_510;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_520,
             msg_16);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_530 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_528 = "";
  a._0_8_ = a._0_8_ & 0xffffffff00000000;
  pvVar7 = (iterator)0x2;
  puVar10 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_178,&local_530,0x147,1,2,puVar10,0xba9066,puVar9,"0");
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = (iterator)puVar10;
  msg_17.m_begin = pvVar7;
  file_18.m_end = (iterator)0x14c;
  file_18.m_begin = (iterator)&local_540;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_550,
             msg_17);
  bf.m_read_pos = 10;
  if (9 >= bf.nSrcPos) {
    bf.m_read_pos = bf.nSrcPos;
  }
  bVar2 = bf.nSrcPos <=
          ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 10U;
  if (!bVar2) {
    bf.m_read_pos =
         bf.nSrcPos -
         ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  a[0] = bVar2 && 9 < bf.nSrcPos;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_188 = "bf.SetPos(10)";
  local_180 = "";
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_0113a070;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  local_560 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_558 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_178,1,0,WARN,(check_type)puVar9,
             (size_t)&local_560,0x14c);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  i = ser_readdata8<BufferedFile>(&bf);
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = pvVar8;
  msg_18.m_begin = pvVar7;
  file_19.m_end = (iterator)0x14e;
  file_19.m_begin = (iterator)&local_570;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_580,
             msg_18);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_588 = "";
  a[0] = '\n';
  a[1] = '\0';
  a[2] = '\0';
  a[3] = '\0';
  pvVar7 = (iterator)0x2;
  puVar9 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_178,&local_590,0x14e,1,2,puVar9,0xba9066,(assertion_result *)a,"10");
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_598 = "";
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = (iterator)puVar9;
  msg_19.m_begin = pvVar7;
  file_20.m_end = (iterator)0x14f;
  file_20.m_begin = (iterator)&local_5a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_5b0,
             msg_19);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_5b8 = "";
  puVar9 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_188 = (char *)CONCAT44(local_188._4_4_,0xb);
  ppcVar11 = &local_188;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_178,&local_5c0,0x14f,1,2,puVar9,0xc3c279,ppcVar11,"11U");
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = (iterator)puVar9;
  msg_20.m_begin = pvVar7;
  file_21.m_end = (iterator)0x153;
  file_21.m_begin = (iterator)&local_5d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_5e0,
             msg_20);
  uVar5 = ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 1;
  bf.m_read_pos = (ulong)(bf.nSrcPos != 0);
  if (uVar5 < bf.nSrcPos) {
    bf.m_read_pos =
         bf.nSrcPos -
         ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  a[0] = bf.nSrcPos - 1 < uVar5;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_188 = "bf.SetPos(1)";
  local_180 = "";
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_0113a070;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_5e8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_178,1,0,WARN,(check_type)ppcVar11,
             (size_t)&local_5f0,0x153);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_5f8 = "";
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = pvVar8;
  msg_21.m_begin = pvVar7;
  file_22.m_end = (iterator)0x154;
  file_22.m_begin = (iterator)&local_600;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_610,
             msg_21);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_620 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_618 = "";
  puVar9 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_188 = (char *)CONCAT44(local_188._4_4_,1);
  pvVar7 = (iterator)0x2;
  puVar10 = puVar9;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_178,&local_620,0x154,1,2,puVar9,0xc3c279,&local_188,"1U");
  i = ser_readdata8<BufferedFile>(&bf);
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_628 = "";
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = (iterator)puVar10;
  msg_22.m_begin = pvVar7;
  file_23.m_end = (iterator)0x156;
  file_23.m_begin = (iterator)&local_630;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_640,
             msg_22);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_650 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_648 = "";
  a[0] = '\x01';
  a[1] = '\0';
  a[2] = '\0';
  a[3] = '\0';
  pvVar7 = (iterator)0x2;
  puVar10 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_178,&local_650,0x156,1,2,puVar10,0xba9066,puVar9,"1");
  local_660 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_658 = "";
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_23.m_end = (iterator)puVar10;
  msg_23.m_begin = pvVar7;
  file_24.m_end = (iterator)0x15a;
  file_24.m_begin = (iterator)&local_660;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_670,
             msg_23);
  bf.m_read_pos = 0xb;
  if (10 >= bf.nSrcPos) {
    bf.m_read_pos = bf.nSrcPos;
  }
  bVar2 = bf.nSrcPos <=
          ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 0xbU;
  if (!bVar2) {
    bf.m_read_pos =
         bf.nSrcPos -
         ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  a[0] = bVar2 && 10 < bf.nSrcPos;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_188 = "bf.SetPos(11)";
  local_180 = "";
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_0113a070;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_678 = "";
  pvVar7 = &DAT_00000001;
  puVar10 = (uint8_t *)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_178,1,0,WARN,(check_type)puVar9,
             (size_t)&local_680,0x15a);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  Unserialize<BufferedFile,_unsigned_char,_29>(&bf,&a);
  for (lVar6 = 0; lVar6 != 0x1d; lVar6 = lVar6 + 1) {
    local_690 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_688 = "";
    local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_698 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_24.m_end = (iterator)puVar10;
    msg_24.m_begin = pvVar7;
    file_25.m_end = (iterator)0x15f;
    file_25.m_begin = (iterator)&local_690;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_6a0,
               msg_24);
    local_178[8] = false;
    local_178._0_8_ = &PTR__lazy_ostream_01139f30;
    local_168 = boost::unit_test::lazy_ostream::inst;
    local_160 = (char **)0xc694e1;
    local_6b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_6a8 = "";
    puVar10 = a + lVar6;
    local_188 = (char *)CONCAT44(local_188._4_4_,(int)lVar6 + 0xb);
    pvVar7 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (local_178,&local_6b0,0x15f,1,2,puVar10,0xc3c343,&local_188,"11 + j");
  }
  local_6c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_6b8 = "";
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_25.m_end = (iterator)puVar10;
  msg_25.m_begin = pvVar7;
  file_26.m_end = (iterator)0x162;
  file_26.m_begin = (iterator)&local_6c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_6d0,
             msg_25);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_6e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_6d8 = "";
  puVar9 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_188 = (char *)CONCAT44(local_188._4_4_,0x28);
  ppcVar11 = &local_188;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_178,&local_6e0,0x162,1,2,puVar9,0xc3c279,ppcVar11,"40U");
  i = ser_readdata8<BufferedFile>(&bf);
  local_6f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_6e8 = "";
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_26.m_end = (iterator)puVar9;
  msg_26.m_begin = pvVar7;
  file_27.m_end = (iterator)0x167;
  file_27.m_begin = (iterator)&local_6f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_700,
             msg_26);
  a._0_8_ = a._0_8_ & 0xffffffffffffff00;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_188 = "false";
  local_180 = "";
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_0113a070;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  local_710 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_708 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_178,1,0,WARN,(check_type)ppcVar11,
             (size_t)&local_710,0x167);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_750 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_748 = "";
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_27.m_end = pvVar8;
  msg_27.m_begin = pvVar7;
  file_28.m_end = (iterator)0x16d;
  file_28.m_begin = (iterator)&local_750;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_760,
             msg_27);
  bVar2 = BufferedFile::eof(&bf);
  a[0] = bVar2;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_188 = "bf.eof()";
  local_180 = "";
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_0113a070;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  local_770 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_768 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_178,1,0,WARN,(check_type)ppcVar11,
             (size_t)&local_770,0x16d);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_780 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_28.m_end = pvVar8;
  msg_28.m_begin = pvVar7;
  file_29.m_end = (iterator)0x170;
  file_29.m_begin = (iterator)&local_780;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_790,
             msg_28);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_798 = "";
  puVar9 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_188 = (char *)CONCAT44(local_188._4_4_,0x28);
  ppcVar11 = &local_188;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_178,&local_7a0,0x170,1,2,puVar9,0xc3c279,ppcVar11,"40U");
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_29.m_end = (iterator)puVar9;
  msg_29.m_begin = pvVar7;
  file_30.m_end = (iterator)0x171;
  file_30.m_begin = (iterator)&local_7b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_7c0,
             msg_29);
  bf.m_read_pos = 0x1e;
  if (0x1d >= bf.nSrcPos) {
    bf.m_read_pos = bf.nSrcPos;
  }
  bVar2 = bf.nSrcPos <=
          ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 0x1eU;
  if (!bVar2) {
    bf.m_read_pos =
         bf.nSrcPos -
         ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  a[0] = bVar2 && 0x1d < bf.nSrcPos;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_188 = "bf.SetPos(30)";
  local_180 = "";
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_0113a070;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_7c8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_178,1,0,WARN,(check_type)ppcVar11,
             (size_t)&local_7d0,0x171);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  i = ser_readdata8<BufferedFile>(&bf);
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_7d8 = "";
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_30.m_end = pvVar8;
  msg_30.m_begin = pvVar7;
  file_31.m_end = (iterator)0x173;
  file_31.m_begin = (iterator)&local_7e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_7f0,
             msg_30);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_7f8 = "";
  a[0] = '\x1e';
  a[1] = '\0';
  a[2] = '\0';
  a[3] = '\0';
  pvVar7 = (iterator)0x2;
  puVar9 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_178,&local_800,0x173,1,2,puVar9,0xba9066,(assertion_result *)a,"30");
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_808 = "";
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_31.m_end = (iterator)puVar9;
  msg_31.m_begin = pvVar7;
  file_32.m_end = (iterator)0x174;
  file_32.m_begin = (iterator)&local_810;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_820,
             msg_31);
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = (char **)0xc694e1;
  local_830 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_828 = "";
  puVar9 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_188 = (char *)CONCAT44(local_188._4_4_,0x1f);
  ppcVar11 = &local_188;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_178,&local_830,0x174,1,2,puVar9,0xc3c279,ppcVar11,"31U");
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_838 = "";
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_32.m_end = (iterator)puVar9;
  msg_32.m_begin = pvVar7;
  file_33.m_end = (iterator)0x177;
  file_33.m_begin = (iterator)&local_840;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_850,
             msg_32);
  uVar5 = (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  bf.m_read_pos = 0;
  if (uVar5 <= bf.nSrcPos) {
    bf.m_read_pos = bf.nSrcPos - uVar5;
  }
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_188 = "!bf.SetPos(0)";
  local_180 = "";
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_0113a070;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  local_860 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_858 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  a[0] = uVar5 <= bf.nSrcPos && bf.nSrcPos - uVar5 != 0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_178,1,0,WARN,(check_type)ppcVar11,
             (size_t)&local_860,0x177);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_870 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_868 = "";
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  local_878 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_33.m_end = pvVar8;
  msg_33.m_begin = pvVar7;
  file_34.m_end = (iterator)0x17a;
  file_34.m_begin = (iterator)&local_870;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_880,
             msg_33);
  a[0] = bf.m_read_pos < 0x1f;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_188 = "bf.GetPos() <= 30U";
  local_180 = "";
  pFVar4 = (FILE *)local_178;
  local_178[8] = false;
  local_178._0_8_ = &PTR__lazy_ostream_0113a070;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = &local_188;
  local_890 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_888 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)pFVar4,1,0,WARN,(check_type)ppcVar11,
             (size_t)&local_890,0x17a);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  AutoFile::fclose(&file,pFVar4);
  std::filesystem::remove((path *)&streams_test_filename);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  AutoFile::~AutoFile(&file);
  std::filesystem::__cxx11::path::~path(&streams_test_filename.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_buffered_file)
{
    fs::path streams_test_filename = m_args.GetDataDirBase() / "streams_test_tmp";
    AutoFile file{fsbridge::fopen(streams_test_filename, "w+b")};

    // The value at each offset is the offset.
    for (uint8_t j = 0; j < 40; ++j) {
        file << j;
    }
    file.seek(0, SEEK_SET);

    // The buffer size (second arg) must be greater than the rewind
    // amount (third arg).
    try {
        BufferedFile bfbad{file, 25, 25};
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(),
                        "Rewind limit must be less than buffer size") != nullptr);
    }

    // The buffer is 25 bytes, allow rewinding 10 bytes.
    BufferedFile bf{file, 25, 10};
    BOOST_CHECK(!bf.eof());

    uint8_t i;
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 1);

    // After reading bytes 0 and 1, we're positioned at 2.
    BOOST_CHECK_EQUAL(bf.GetPos(), 2U);

    // Rewind to offset 0, ok (within the 10 byte window).
    BOOST_CHECK(bf.SetPos(0));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);

    // We can go forward to where we've been, but beyond may fail.
    BOOST_CHECK(bf.SetPos(2));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 2);

    // If you know the maximum number of bytes that should be
    // read to deserialize the variable, you can limit the read
    // extent. The current file offset is 3, so the following
    // SetLimit() allows zero bytes to be read.
    BOOST_CHECK(bf.SetLimit(3));
    try {
        bf >> i;
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(),
                           "Attempt to position past buffer limit") != nullptr);
    }
    // The default argument removes the limit completely.
    BOOST_CHECK(bf.SetLimit());
    // The read position should still be at 3 (no change).
    BOOST_CHECK_EQUAL(bf.GetPos(), 3U);

    // Read from current offset, 3, forward until position 10.
    for (uint8_t j = 3; j < 10; ++j) {
        bf >> i;
        BOOST_CHECK_EQUAL(i, j);
    }
    BOOST_CHECK_EQUAL(bf.GetPos(), 10U);

    // We're guaranteed (just barely) to be able to rewind to zero.
    BOOST_CHECK(bf.SetPos(0));
    BOOST_CHECK_EQUAL(bf.GetPos(), 0U);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);

    // We can set the position forward again up to the farthest
    // into the stream we've been, but no farther. (Attempting
    // to go farther may succeed, but it's not guaranteed.)
    BOOST_CHECK(bf.SetPos(10));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 10);
    BOOST_CHECK_EQUAL(bf.GetPos(), 11U);

    // Now it's only guaranteed that we can rewind to offset 1
    // (current read position, 11, minus rewind amount, 10).
    BOOST_CHECK(bf.SetPos(1));
    BOOST_CHECK_EQUAL(bf.GetPos(), 1U);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 1);

    // We can stream into large variables, even larger than
    // the buffer size.
    BOOST_CHECK(bf.SetPos(11));
    {
        uint8_t a[40 - 11];
        bf >> a;
        for (uint8_t j = 0; j < sizeof(a); ++j) {
            BOOST_CHECK_EQUAL(a[j], 11 + j);
        }
    }
    BOOST_CHECK_EQUAL(bf.GetPos(), 40U);

    // We've read the entire file, the next read should throw.
    try {
        bf >> i;
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(),
                        "BufferedFile::Fill: end of file") != nullptr);
    }
    // Attempting to read beyond the end sets the EOF indicator.
    BOOST_CHECK(bf.eof());

    // Still at offset 40, we can go back 10, to 30.
    BOOST_CHECK_EQUAL(bf.GetPos(), 40U);
    BOOST_CHECK(bf.SetPos(30));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 30);
    BOOST_CHECK_EQUAL(bf.GetPos(), 31U);

    // We're too far to rewind to position zero.
    BOOST_CHECK(!bf.SetPos(0));
    // But we should now be positioned at least as far back as allowed
    // by the rewind window (relative to our farthest read position, 40).
    BOOST_CHECK(bf.GetPos() <= 30U);

    // We can explicitly close the file, or the destructor will do it.
    file.fclose();

    fs::remove(streams_test_filename);
}